

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O2

bool __thiscall RoboClaw::write_n(RoboClaw *this,uint8_t byte,...)

{
  byte data;
  ushort uVar1;
  char in_AL;
  void **ppvVar2;
  ssize_t sVar3;
  uint uVar4;
  void **in_RCX;
  ulong uVar5;
  undefined8 in_RDX;
  void *__buf;
  undefined8 in_R8;
  undefined8 in_R9;
  char cVar6;
  uint8_t uVar7;
  bool bVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  void **local_100;
  void *local_e8 [3];
  void **local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar6 = '\x02';
  local_e8[2] = (void *)in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    this->m_crc = 0;
    local_100 = &marker[0].overflow_arg_area;
    uVar4 = 0x10;
    uVar7 = byte;
    while (bVar8 = uVar7 != '\0', uVar7 = uVar7 + 0xff, bVar8) {
      uVar5 = (ulong)uVar4;
      if (uVar5 < 0x29) {
        uVar4 = uVar4 + 8;
        in_RCX = (void **)(ulong)uVar4;
        ppvVar2 = (void **)((long)local_e8 + uVar5);
      }
      else {
        in_RCX = local_100 + 1;
        ppvVar2 = local_100;
        local_100 = in_RCX;
      }
      data = *(byte *)ppvVar2;
      crc_update(this,data);
      (**this->_vptr_RoboClaw)(this,(ulong)data);
    }
    uVar1 = this->m_crc;
    (**this->_vptr_RoboClaw)(this,(ulong)(uVar1 >> 8));
    (**this->_vptr_RoboClaw)(this,(ulong)(byte)uVar1);
    sVar3 = read(this,this->m_timeout,__buf,(size_t)in_RCX);
    bVar8 = cVar6 == '\0';
    cVar6 = cVar6 + -1;
    in_RCX = (void **)CONCAT71((int7)((ulong)in_RCX >> 8),bVar8);
  } while (((char)sVar3 != -1) && (!bVar8));
  return (char)sVar3 == -1;
}

Assistant:

bool RoboClaw::write_n(uint8_t byte, ... )
{
    uint8_t trys=MAXRETRY;
    do{
        crc_clear();
        //send data with crc
        va_list marker;
        va_start( marker, byte );     /* Initialize variable arguments. */
        for( uint8_t index=0; index<byte; index++ )
        {
            uint8_t data = va_arg(marker, int);
            crc_update(data);
            write(data);
        }
        va_end( marker );              /* Reset variable arguments.      */
        uint16_t crc = crc_get();
        write(crc>>8);
        write(crc);
        if( read( m_timeout ) == 0xFF )
            return true;
    } while( trys-- );
    return false;
}